

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::CollectSideEffects(cmComputeTargetDepends *this)

{
  size_type sVar1;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int n;
  cmComputeTargetDepends *this_local;
  
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,0);
  sVar1 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,sVar1);
  sVar1 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)sVar1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  for (local_4c = 0; local_4c < visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      local_4c = local_4c + 1) {
    CollectSideEffectsForTarget
              (this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_48,local_4c);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffects()
{
  this->SideEffects.resize(0);
  this->SideEffects.resize(this->InitialGraph.size());

  int n = static_cast<int>(this->InitialGraph.size());
  std::set<int> visited;
  for (int i = 0; i < n; ++i) {
    this->CollectSideEffectsForTarget(visited, i);
  }
}